

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_loadDEntropy(ZSTD_entropyDTables_t *entropy,void *dict,size_t dictSize)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  void *workspace;
  uint matchlengthLog;
  uint matchlengthMaxValue;
  size_t local_b8;
  size_t local_b0;
  short matchlengthNCount [53];
  
  sVar6 = 0xffffffffffffffe2;
  if ((8 < dictSize) &&
     (sVar2 = HUF_readDTableX2_wksp
                        (entropy->hufTable,(void *)((long)dict + 8),dictSize - 8,entropy,0x2818),
     sVar2 < 0xffffffffffffff89)) {
    uVar8 = dictSize + (long)dict;
    pvVar7 = (void *)((long)dict + sVar2 + 8);
    matchlengthMaxValue = 0x1f;
    sVar3 = FSE_readNCount(matchlengthNCount,&matchlengthMaxValue,&matchlengthLog,pvVar7,
                           uVar8 - (long)pvVar7);
    if ((sVar3 < 0xffffffffffffff89) && ((matchlengthMaxValue < 0x20 && (matchlengthLog < 9)))) {
      ZSTD_buildFSETable(entropy->OFTable,matchlengthNCount,matchlengthMaxValue,OF_base,OF_bits,
                         matchlengthLog);
      pvVar7 = (void *)((long)pvVar7 + sVar3);
      matchlengthMaxValue = 0x34;
      local_b8 = FSE_readNCount(matchlengthNCount,&matchlengthMaxValue,&matchlengthLog,pvVar7,
                                uVar8 - (long)pvVar7);
      if ((local_b8 < 0xffffffffffffff89) && ((matchlengthMaxValue < 0x35 && (matchlengthLog < 10)))
         ) {
        ZSTD_buildFSETable(entropy->MLTable,matchlengthNCount,matchlengthMaxValue,ML_base,ML_bits,
                           matchlengthLog);
        pvVar7 = (void *)((long)pvVar7 + local_b8);
        matchlengthMaxValue = 0x23;
        local_b0 = FSE_readNCount(matchlengthNCount,&matchlengthMaxValue,&matchlengthLog,pvVar7,
                                  uVar8 - (long)pvVar7);
        if ((local_b0 < 0xffffffffffffff89) &&
           ((matchlengthMaxValue < 0x24 && (matchlengthLog < 10)))) {
          ZSTD_buildFSETable(entropy->LLTable,matchlengthNCount,matchlengthMaxValue,LL_base,LL_bits,
                             matchlengthLog);
          uVar4 = (long)pvVar7 + local_b0 + 0xc;
          if (uVar4 <= uVar8) {
            for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
              uVar1 = *(uint *)((long)pvVar7 + lVar5 + local_b0);
              if ((ulong)uVar1 == 0) {
                return 0xffffffffffffffe2;
              }
              if (uVar8 - uVar4 <= (ulong)uVar1) {
                return 0xffffffffffffffe2;
              }
              *(uint *)((long)entropy->rep + lVar5) = uVar1;
            }
            sVar6 = local_b8 + local_b0 + sVar2 + sVar3 + 0x14;
          }
        }
      }
    }
  }
  return sVar6;
}

Assistant:

size_t
ZSTD_loadDEntropy(ZSTD_entropyDTables_t* entropy,
                  const void* const dict, size_t const dictSize)
{
    const BYTE* dictPtr = (const BYTE*)dict;
    const BYTE* const dictEnd = dictPtr + dictSize;

    if (dictSize <= 8) return ERROR(dictionary_corrupted);
    assert(MEM_readLE32(dict) == ZSTD_MAGIC_DICTIONARY);   /* dict must be valid */
    dictPtr += 8;   /* skip header = magic + dictID */

    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, OFTable) == offsetof(ZSTD_entropyDTables_t, LLTable) + sizeof(entropy->LLTable));
    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, MLTable) == offsetof(ZSTD_entropyDTables_t, OFTable) + sizeof(entropy->OFTable));
    ZSTD_STATIC_ASSERT(sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable) >= HUF_DECOMPRESS_WORKSPACE_SIZE);
    {   void* const workspace = &entropy->LLTable;   /* use fse tables as temporary workspace; implies fse tables are grouped together */
        size_t const workspaceSize = sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable);
#ifdef HUF_FORCE_DECOMPRESS_X1
        /* in minimal huffman, we always use X1 variants */
        size_t const hSize = HUF_readDTableX1_wksp(entropy->hufTable,
                                                dictPtr, dictEnd - dictPtr,
                                                workspace, workspaceSize);
#else
        size_t const hSize = HUF_readDTableX2_wksp(entropy->hufTable,
                                                dictPtr, dictEnd - dictPtr,
                                                workspace, workspaceSize);
#endif
        if (HUF_isError(hSize)) return ERROR(dictionary_corrupted);
        dictPtr += hSize;
    }

    {   short offcodeNCount[MaxOff+1];
        unsigned offcodeMaxValue = MaxOff, offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(offcodeHeaderSize)) return ERROR(dictionary_corrupted);
        if (offcodeMaxValue > MaxOff) return ERROR(dictionary_corrupted);
        if (offcodeLog > OffFSELog) return ERROR(dictionary_corrupted);
        ZSTD_buildFSETable( entropy->OFTable,
                            offcodeNCount, offcodeMaxValue,
                            OF_base, OF_bits,
                            offcodeLog);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(matchlengthHeaderSize)) return ERROR(dictionary_corrupted);
        if (matchlengthMaxValue > MaxML) return ERROR(dictionary_corrupted);
        if (matchlengthLog > MLFSELog) return ERROR(dictionary_corrupted);
        ZSTD_buildFSETable( entropy->MLTable,
                            matchlengthNCount, matchlengthMaxValue,
                            ML_base, ML_bits,
                            matchlengthLog);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(litlengthHeaderSize)) return ERROR(dictionary_corrupted);
        if (litlengthMaxValue > MaxLL) return ERROR(dictionary_corrupted);
        if (litlengthLog > LLFSELog) return ERROR(dictionary_corrupted);
        ZSTD_buildFSETable( entropy->LLTable,
                            litlengthNCount, litlengthMaxValue,
                            LL_base, LL_bits,
                            litlengthLog);
        dictPtr += litlengthHeaderSize;
    }

    if (dictPtr+12 > dictEnd) return ERROR(dictionary_corrupted);
    {   int i;
        size_t const dictContentSize = (size_t)(dictEnd - (dictPtr+12));
        for (i=0; i<3; i++) {
            U32 const rep = MEM_readLE32(dictPtr); dictPtr += 4;
            if (rep==0 || rep >= dictContentSize) return ERROR(dictionary_corrupted);
            entropy->rep[i] = rep;
    }   }

    return dictPtr - (const BYTE*)dict;
}